

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiColumns *this;
  ImGuiColumnData *pIVar5;
  ImGuiColumnsFlags in_EDX;
  ImGuiID in_ESI;
  ImGuiWindow *in_RDI;
  float fVar6;
  float fVar7;
  float x2;
  float fVar8;
  float y1;
  float fVar9;
  float width;
  float offset_1;
  float offset_0;
  float clip_x2;
  float clip_x1;
  ImGuiColumnData *column_1;
  int n_1;
  ImGuiColumnData column;
  int n;
  float max_2;
  float max_1;
  float half_clip_extend_x;
  float column_padding;
  ImGuiColumns *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float local_88;
  float in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  int local_64;
  int local_44;
  float fVar10;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindow();
  if ((int)in_ESI < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1db0,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((pIVar4->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1db1,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  IVar3 = GetColumnsID((char *)in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c);
  this = FindOrCreateColumns(in_RDI,in_ESI);
  if (this->ID != IVar3) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1db6,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  this->Current = 0;
  this->Count = in_ESI;
  this->Flags = in_EDX;
  (pIVar4->DC).CurrentColumns = this;
  this->HostCursorPosY = (pIVar4->DC).CursorPos.y;
  this->HostCursorMaxPosX = (pIVar4->DC).CursorMaxPos.x;
  (this->HostClipRect).Min = (pIVar4->ClipRect).Min;
  (this->HostClipRect).Max = (pIVar4->ClipRect).Max;
  (this->HostWorkRect).Min = (pIVar4->WorkRect).Min;
  (this->HostWorkRect).Max = (pIVar4->WorkRect).Max;
  fVar10 = (pIVar2->Style).ItemSpacing.x;
  fVar6 = ImMax<float>((pIVar4->WindowPadding).x * 0.5,pIVar4->WindowBorderSize);
  fVar7 = ImFloor(fVar6);
  x2 = (pIVar4->WorkRect).Max.x + fVar10;
  fVar8 = ImMax<float>(fVar10 - (pIVar4->WindowPadding).x,0.0);
  fVar8 = x2 - fVar8;
  fVar6 = (pIVar4->WorkRect).Max.x + fVar7;
  y1 = (pIVar4->DC).Indent.x - fVar10;
  fVar9 = ImMax<float>(fVar10 - (pIVar4->WindowPadding).x,0.0);
  this->OffMinX = y1 + fVar9;
  fVar6 = ImMin<float>(fVar8,fVar6);
  fVar6 = ImMax<float>(fVar6 - (pIVar4->Pos).x,this->OffMinX + 1.0);
  this->OffMaxX = fVar6;
  fVar6 = (pIVar4->DC).CursorPos.y;
  this->LineMaxY = fVar6;
  this->LineMinY = fVar6;
  if (((this->Columns).Size != 0) && ((this->Columns).Size != in_ESI + 1)) {
    ImVector<ImGuiColumnData>::resize
              ((ImVector<ImGuiColumnData> *)CONCAT44(x2,in_stack_ffffffffffffff60),
               (int)in_stack_ffffffffffffff5c);
  }
  this->IsFirstFrame = (this->Columns).Size == 0;
  if ((this->Columns).Size == 0) {
    ImVector<ImGuiColumnData>::reserve
              ((ImVector<ImGuiColumnData> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)in_stack_ffffffffffffff6c);
    for (local_44 = 0; local_44 < (int)(in_ESI + 1); local_44 = local_44 + 1) {
      ImGuiColumnData::ImGuiColumnData((ImGuiColumnData *)CONCAT44(x2,in_stack_ffffffffffffff60));
      ImVector<ImGuiColumnData>::push_back
                ((ImVector<ImGuiColumnData> *)CONCAT44(x2,in_stack_ffffffffffffff60),
                 (ImGuiColumnData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  for (local_64 = 0; local_64 < (int)in_ESI; local_64 = local_64 + 1) {
    pIVar5 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)CONCAT44(x2,in_stack_ffffffffffffff60),
                        (int)in_stack_ffffffffffffff5c);
    in_stack_ffffffffffffff5c = (pIVar4->Pos).x;
    GetColumnOffset(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff60 = (pIVar4->Pos).x;
    GetColumnOffset(in_stack_ffffffffffffff70);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,y1,x2,in_stack_ffffffffffffff60);
    IVar1.y = in_stack_ffffffffffffff7c;
    IVar1.x = local_88;
    (pIVar5->ClipRect).Min = IVar1;
    (pIVar5->ClipRect).Max = in_stack_ffffffffffffff80;
    ImRect::ClipWith((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (ImRect *)CONCAT44(in_stack_ffffffffffffff6c,y1));
  }
  if (1 < this->Count) {
    ImDrawListSplitter::Split
              ((ImDrawListSplitter *)this,(ImDrawList *)CONCAT44(fVar10,fVar7),(int)fVar8);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (ImDrawList *)CONCAT44(in_stack_ffffffffffffff6c,y1),(int)x2);
    PushColumnClipRect(in_stack_ffffffffffffff74);
  }
  fVar6 = GetColumnOffset(in_stack_ffffffffffffff70);
  fVar7 = GetColumnOffset(in_stack_ffffffffffffff70);
  PushItemWidth(fVar6);
  fVar6 = ImMax<float>(fVar10 - (pIVar4->WindowPadding).x,0.0);
  (pIVar4->DC).ColumnsOffset.x = fVar6;
  (pIVar4->DC).CursorPos.x =
       (float)(int)((pIVar4->Pos).x + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
  (pIVar4->WorkRect).Max.x = ((pIVar4->Pos).x + fVar7) - fVar10;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}